

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.c
# Opt level: O3

int mj_effect_pixelate(mj_jpeg_t *m)

{
  undefined8 *puVar1;
  uint uVar2;
  jpeg_component_info *pjVar3;
  JBLOCKROW paJVar4;
  int iVar5;
  JBLOCKARRAY ppaJVar6;
  long lVar7;
  JDIMENSION JVar8;
  long lVar9;
  
  iVar5 = 2;
  if ((m != (mj_jpeg_t *)0x0) && (m->coef != (jvirt_barray_ptr *)0x0)) {
    iVar5 = (m->cinfo).num_components;
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        pjVar3 = (m->cinfo).comp_info;
        if (pjVar3[lVar9].height_in_blocks != 0) {
          JVar8 = 0;
          do {
            ppaJVar6 = (*((m->cinfo).mem)->access_virt_barray)
                                 ((j_common_ptr)m,m->coef[lVar9],JVar8,1,1);
            uVar2 = pjVar3[lVar9].width_in_blocks;
            if ((ulong)uVar2 != 0) {
              paJVar4 = *ppaJVar6;
              lVar7 = 0;
              do {
                *(undefined8 *)((long)*paJVar4 + lVar7 + 8) = 0;
                *(undefined8 *)((long)*paJVar4 + lVar7 + 2) = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x10);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x20);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x30);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x40);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x50);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x60);
                *puVar1 = 0;
                puVar1[1] = 0;
                puVar1 = (undefined8 *)((long)*paJVar4 + lVar7 + 0x70);
                *puVar1 = 0;
                puVar1[1] = 0;
                lVar7 = lVar7 + 0x80;
              } while ((ulong)uVar2 << 7 != lVar7);
            }
            JVar8 = JVar8 + 1;
          } while (JVar8 < pjVar3[lVar9].height_in_blocks);
          iVar5 = (m->cinfo).num_components;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar5);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int mj_effect_pixelate(mj_jpeg_t *m) {
    int                  i, c;
    JDIMENSION           k, l;
    jpeg_component_info *component;
    JBLOCKARRAY          blocks;
    JCOEFPTR             coefs;

    if(m == NULL || m->coef == NULL) {
        return MJ_ERR_NULL_DATA;
    }

    /* Set all the AC coefficients to 0 */
    for(c = 0; c < m->cinfo.num_components; c++) {
        component = &m->cinfo.comp_info[c];

        for(l = 0; l < component->height_in_blocks; l++) {
            blocks = (*m->cinfo.mem->access_virt_barray)((j_common_ptr)&m->cinfo, m->coef[c], l, 1, TRUE);

            for(k = 0; k < component->width_in_blocks; k++) {
                coefs = blocks[0][k];

                coefs[1] = 0;
                coefs[2] = 0;
                coefs[3] = 0;
                coefs[4] = 0;
                coefs[5] = 0;
                coefs[6] = 0;
                coefs[7] = 0;

                for(i = 8; i < DCTSIZE2; i += 8) {
                    coefs[i + 0] = 0;
                    coefs[i + 1] = 0;
                    coefs[i + 2] = 0;
                    coefs[i + 3] = 0;
                    coefs[i + 4] = 0;
                    coefs[i + 5] = 0;
                    coefs[i + 6] = 0;
                    coefs[i + 7] = 0;
                }
            }
        }
    }

    return MJ_OK;
}